

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printer.cpp
# Opt level: O0

void __thiscall mjs::print_visitor::operator()(print_visitor *this,switch_statement *s)

{
  bool bVar1;
  expression *e_00;
  clause_list *this_00;
  reference this_01;
  unique_ptr *this_02;
  type e_01;
  statement_list *this_03;
  reference this_04;
  type s_00;
  unique_ptr<mjs::statement,_std::default_delete<mjs::statement>_> *cs;
  const_iterator __end3;
  const_iterator __begin3;
  statement_list *__range3;
  expression_ptr *e;
  case_clause *c;
  const_iterator __end2;
  const_iterator __begin2;
  clause_list *__range2;
  switch_statement *s_local;
  print_visitor *this_local;
  
  std::operator<<(this->os_,"switch (");
  e_00 = switch_statement::e(s);
  accept<mjs::print_visitor>(e_00,this);
  std::operator<<(this->os_,") {");
  this_00 = switch_statement::cl(s);
  __end2 = std::vector<mjs::case_clause,_std::allocator<mjs::case_clause>_>::begin(this_00);
  c = (case_clause *)std::vector<mjs::case_clause,_std::allocator<mjs::case_clause>_>::end(this_00);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end2,(__normal_iterator<const_mjs::case_clause_*,_std::vector<mjs::case_clause,_std::allocator<mjs::case_clause>_>_>
                                *)&c);
    if (!bVar1) break;
    this_01 = __gnu_cxx::
              __normal_iterator<const_mjs::case_clause_*,_std::vector<mjs::case_clause,_std::allocator<mjs::case_clause>_>_>
              ::operator*(&__end2);
    std::operator<<(this->os_," ");
    this_02 = (unique_ptr *)case_clause::e(this_01);
    bVar1 = std::unique_ptr::operator_cast_to_bool(this_02);
    if (bVar1) {
      std::operator<<(this->os_,"case ");
      e_01 = std::unique_ptr<mjs::expression,_std::default_delete<mjs::expression>_>::operator*
                       ((unique_ptr<mjs::expression,_std::default_delete<mjs::expression>_> *)
                        this_02);
      accept<mjs::print_visitor>(e_01,this);
    }
    else {
      std::operator<<(this->os_,"default");
    }
    std::operator<<(this->os_,": ");
    this_03 = case_clause::sl(this_01);
    __end3 = std::
             vector<std::unique_ptr<mjs::statement,_std::default_delete<mjs::statement>_>,_std::allocator<std::unique_ptr<mjs::statement,_std::default_delete<mjs::statement>_>_>_>
             ::begin(this_03);
    cs = (unique_ptr<mjs::statement,_std::default_delete<mjs::statement>_> *)
         std::
         vector<std::unique_ptr<mjs::statement,_std::default_delete<mjs::statement>_>,_std::allocator<std::unique_ptr<mjs::statement,_std::default_delete<mjs::statement>_>_>_>
         ::end(this_03);
    while( true ) {
      bVar1 = __gnu_cxx::operator!=
                        (&__end3,(__normal_iterator<const_std::unique_ptr<mjs::statement,_std::default_delete<mjs::statement>_>_*,_std::vector<std::unique_ptr<mjs::statement,_std::default_delete<mjs::statement>_>,_std::allocator<std::unique_ptr<mjs::statement,_std::default_delete<mjs::statement>_>_>_>_>
                                  *)&cs);
      if (!bVar1) break;
      this_04 = __gnu_cxx::
                __normal_iterator<const_std::unique_ptr<mjs::statement,_std::default_delete<mjs::statement>_>_*,_std::vector<std::unique_ptr<mjs::statement,_std::default_delete<mjs::statement>_>,_std::allocator<std::unique_ptr<mjs::statement,_std::default_delete<mjs::statement>_>_>_>_>
                ::operator*(&__end3);
      s_00 = std::unique_ptr<mjs::statement,_std::default_delete<mjs::statement>_>::operator*
                       (this_04);
      accept<mjs::print_visitor>(s_00,this);
      __gnu_cxx::
      __normal_iterator<const_std::unique_ptr<mjs::statement,_std::default_delete<mjs::statement>_>_*,_std::vector<std::unique_ptr<mjs::statement,_std::default_delete<mjs::statement>_>,_std::allocator<std::unique_ptr<mjs::statement,_std::default_delete<mjs::statement>_>_>_>_>
      ::operator++(&__end3);
    }
    __gnu_cxx::
    __normal_iterator<const_mjs::case_clause_*,_std::vector<mjs::case_clause,_std::allocator<mjs::case_clause>_>_>
    ::operator++(&__end2);
  }
  std::operator<<(this->os_,"}");
  return;
}

Assistant:

void operator()(const switch_statement& s) {
        os_ << "switch (";
        accept(s.e(), *this);
        os_ << ") {";
        for (const auto& c: s.cl()) {
            os_ << " ";
            if (const auto& e = c.e()) {
                os_ << "case ";
                accept(*e, *this);
            } else {
                os_ << "default";
            }
            os_ << ": ";
            for (const auto& cs: c.sl()) {
                accept(*cs, *this);
            }
        }
        os_ << "}";
    }